

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_wrp.c
# Opt level: O0

int aes_wrap_cipher(void *vctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  ulong in_RCX;
  long *in_RDX;
  char *in_RDI;
  char *in_R8;
  ulong in_R9;
  size_t len;
  PROV_AES_WRAP_CTX *ctx;
  char *inlen;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  inlen = in_RDI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (in_R9 == 0) {
    *in_RDX = 0;
    iVar1 = 1;
  }
  else if (in_RCX < in_R9) {
    ERR_new();
    ERR_set_debug(in_R8,(int)(in_R9 >> 0x20),in_RDI);
    ERR_set_error(0x39,0x6a,(char *)0x0);
    iVar1 = 0;
  }
  else {
    iVar1 = aes_wrap_cipher_internal
                      (ctx,(uchar *)len,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)inlen);
    if ((long)iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      *in_RDX = (long)iVar1;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int aes_wrap_cipher(void *vctx,
                           unsigned char *out, size_t *outl, size_t outsize,
                           const unsigned char *in, size_t inl)
{
    PROV_AES_WRAP_CTX *ctx = (PROV_AES_WRAP_CTX *)vctx;
    size_t len;

    if (!ossl_prov_is_running())
        return 0;

    if (inl == 0) {
        *outl = 0;
        return 1;
    }

    if (outsize < inl) {
        ERR_raise(ERR_LIB_PROV, PROV_R_OUTPUT_BUFFER_TOO_SMALL);
        return 0;
    }

    len = aes_wrap_cipher_internal(ctx, out, in, inl);
    if (len <= 0)
        return 0;

    *outl = len;
    return 1;
}